

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

pair<const_char_*,_unsigned_long> __thiscall
naive_trie::get_longest_prefix(naive_trie *this,char *key,size_t len,size_t offset)

{
  bool bVar1;
  char *in_RCX;
  char *in_RDX;
  naive_trie *in_RSI;
  char **in_RDI;
  const_iterator res;
  char c;
  map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  *in_stack_ffffffffffffffa8;
  _Self local_48;
  _Self local_40;
  undefined7 in_stack_ffffffffffffffc8;
  char cVar2;
  pair<const_char_*,_unsigned_long> local_10;
  
  if ((in_RDX == (char *)0x0) || (in_RCX == in_RDX)) {
    local_10 = std::make_pair<char_const*&,unsigned_long&>
                         (in_RDI,(unsigned_long *)in_stack_ffffffffffffffa8);
  }
  else {
    cVar2 = in_RCX[(long)&in_RSI->children];
    local_40._M_node =
         (_Base_ptr)
         llama_vocab::std::
         map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type_conflict2 *)0x54a764);
    local_48._M_node =
         (_Base_ptr)
         llama_vocab::std::
         map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = llama_vocab::std::operator!=(&local_40,&local_48);
    if (bVar1) {
      llama_vocab::std::_Rb_tree_const_iterator<std::pair<const_char,_naive_trie>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_char,_naive_trie>_> *)0x54a797);
      local_10 = get_longest_prefix(in_RSI,in_RDX,(size_t)in_RCX,
                                    CONCAT17(cVar2,in_stack_ffffffffffffffc8));
    }
    else {
      local_10 = std::make_pair<char_const*&,unsigned_long&>
                           (in_RDI,(unsigned_long *)in_stack_ffffffffffffffa8);
    }
  }
  return local_10;
}

Assistant:

std::pair<const char *, size_t> get_longest_prefix(const char * key, size_t len, size_t offset = 0) const {
        if (len == 0 || offset == len) {
            return std::make_pair(key, offset);
        }
        char c = key[offset];
        auto res = children.find(c);
        if (res != children.end()) {
            return res->second.get_longest_prefix(key, len, offset + 1);
        }

        return std::make_pair(key, offset);
    }